

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::SplitPath
               (string *p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,bool expand_home_dir)

{
  char cVar1;
  char *__s;
  size_type sVar2;
  char *pcVar3;
  passwd *ppVar4;
  string homedir;
  char *first;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(components,
                    (components->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar3 = SplitPathRootComponent(p,&local_50);
  if (((expand_home_dir) && (local_50._M_string_length != 0)) && (*local_50._M_dataplus._M_p == '~')
     ) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::resize((ulong)&local_50,(char)local_50._M_string_length + -1);
    if (local_50._M_string_length == 1) {
      GetEnv("HOME",&local_70);
    }
    else {
      ppVar4 = getpwnam(local_50._M_dataplus._M_p + 1);
      sVar2 = local_70._M_string_length;
      if ((ppVar4 != (passwd *)0x0) && (__s = ppVar4->pw_dir, __s != (char *)0x0)) {
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)sVar2,(ulong)__s);
      }
    }
    if (((char *)local_70._M_string_length != (char *)0x0) &&
       (((local_70._M_dataplus._M_p + -1)[local_70._M_string_length] == '\\' ||
        ((local_70._M_dataplus._M_p + -1)[local_70._M_string_length] == '/')))) {
      std::__cxx11::string::resize((ulong)&local_70,(char)local_70._M_string_length + -1);
    }
    SplitPath(&local_70,components,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_dataplus._M_p = pcVar3;
  local_50._M_dataplus._M_p = pcVar3;
  do {
    cVar1 = *local_70._M_dataplus._M_p;
    if ((cVar1 == '/') || (cVar1 == '\\')) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                 (char **)&local_50,(char **)&local_70);
      local_50._M_dataplus._M_p = local_70._M_dataplus._M_p + 1;
    }
    else if (cVar1 == '\0') {
      if (local_70._M_dataplus._M_p != pcVar3) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                   (char **)&local_50,(char **)&local_70);
      }
      return;
    }
    local_70._M_dataplus._M_p = local_70._M_dataplus._M_p + 1;
  } while( true );
}

Assistant:

void SystemTools::SplitPath(const std::string& p,
                            std::vector<std::string>& components,
                            bool expand_home_dir)
{
  const char* c;
  components.clear();

  // Identify the root component.
  {
    std::string root;
    c = SystemTools::SplitPathRootComponent(p, &root);

    // Expand home directory references if requested.
    if (expand_home_dir && !root.empty() && root[0] == '~') {
      std::string homedir;
      root.resize(root.size() - 1);
      if (root.size() == 1) {
#if defined(_WIN32) && !defined(__CYGWIN__)
        if (!SystemTools::GetEnv("USERPROFILE", homedir))
#endif
          SystemTools::GetEnv("HOME", homedir);
      }
#ifdef HAVE_GETPWNAM
      else if (passwd* pw = getpwnam(root.c_str() + 1)) {
        if (pw->pw_dir) {
          homedir = pw->pw_dir;
        }
      }
#endif
      if (!homedir.empty() &&
          (homedir.back() == '/' || homedir.back() == '\\')) {
        homedir.resize(homedir.size() - 1);
      }
      SystemTools::SplitPath(homedir, components);
    } else {
      components.push_back(root);
    }
  }

  // Parse the remaining components.
  const char* first = c;
  const char* last = first;
  for (; *last; ++last) {
    if (*last == '/' || *last == '\\') {
      // End of a component.  Save it.
      components.emplace_back(first, last);
      first = last + 1;
    }
  }

  // Save the last component unless there were no components.
  if (last != c) {
    components.emplace_back(first, last);
  }
}